

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O3

Float __thiscall
pbrt::MeasuredBxDF::PDF
          (MeasuredBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode,
          BxDFReflTransFlags sampleFlags)

{
  undefined8 uVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  float __x;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float __x_00;
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  Float FVar19;
  PLSample PVar20;
  Float params [2];
  float local_78;
  float local_18;
  float local_14;
  undefined1 extraout_var [60];
  
  auVar17._4_60_ = wi._12_60_;
  auVar17._0_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar16 = auVar17._0_16_;
  auVar15._8_56_ = wi._8_56_;
  auVar15._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar14 = auVar15._0_16_;
  fVar3 = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar10._8_56_ = wo._8_56_;
  auVar10._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8 = auVar10._0_16_;
  FVar19 = 0.0;
  if (((sampleFlags & Reflection) != Unset) && (0.0 < fVar3 * auVar17._0_4_)) {
    if (fVar3 < 0.0) {
      auVar8._0_8_ = auVar10._0_8_ ^ 0x8000000080000000;
      auVar8._8_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z ^ 0x80000000;
      auVar8._12_4_ = wo._12_4_ ^ 0x80000000;
      fVar3 = -fVar3;
      auVar14._0_8_ = auVar15._0_8_ ^ 0x8000000080000000;
      auVar14._8_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.z ^ 0x80000000;
      auVar14._12_4_ = wi._12_4_ ^ 0x80000000;
      auVar16._0_8_ = CONCAT44(wi._12_4_,auVar17._0_4_) ^ 0x8000000080000000;
      auVar16._8_4_ = wi._16_4_ ^ 0x80000000;
      auVar16._12_4_ = wi._20_4_ ^ 0x80000000;
    }
    __x_00 = auVar14._0_4_;
    auVar18._0_4_ = __x_00 + auVar8._0_4_;
    auVar18._4_4_ = auVar14._4_4_ + auVar8._4_4_;
    auVar18._8_4_ = auVar14._8_4_ + auVar8._8_4_;
    auVar18._12_4_ = auVar14._12_4_ + auVar8._12_4_;
    fVar3 = auVar16._0_4_ + fVar3;
    FVar19 = 0.0;
    auVar12._0_4_ = auVar18._0_4_ * auVar18._0_4_;
    auVar12._4_4_ = auVar18._4_4_ * auVar18._4_4_;
    auVar12._8_4_ = auVar18._8_4_ * auVar18._8_4_;
    auVar12._12_4_ = auVar18._12_4_ * auVar18._12_4_;
    auVar8 = vmovshdup_avx(auVar12);
    auVar8 = vfmadd231ss_fma(auVar8,auVar18,auVar18);
    auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar3),ZEXT416((uint)fVar3));
    if ((auVar8._0_4_ != 0.0) || (NAN(auVar8._0_4_))) {
      auVar8 = vsqrtss_avx(auVar8,auVar8);
      fVar7 = auVar8._0_4_;
      fVar3 = fVar3 / fVar7;
      uVar1 = vcmpss_avx512f(auVar16,SUB6416(ZEXT464(0xbf800000),0),1);
      bVar2 = (bool)((byte)uVar1 & 1);
      auVar8 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar16);
      fVar4 = acosf((float)((uint)bVar2 * -0x40800000 + (uint)!bVar2 * auVar8._0_4_));
      auVar14 = vmovshdup_avx(auVar14);
      fVar5 = atan2f(auVar14._0_4_,__x_00);
      auVar8 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)fVar3));
      uVar1 = vcmpss_avx512f(ZEXT416((uint)fVar3),SUB6416(ZEXT464(0xbf800000),0),1);
      bVar2 = (bool)((byte)uVar1 & 1);
      fVar6 = acosf((float)((uint)bVar2 * -0x40800000 + (uint)!bVar2 * auVar8._0_4_));
      fVar6 = fVar6 * 0.63661975;
      auVar9._4_4_ = fVar7;
      auVar9._0_4_ = fVar7;
      auVar9._8_4_ = fVar7;
      auVar9._12_4_ = fVar7;
      auVar8 = vdivps_avx(auVar18,auVar9);
      auVar12 = vmovshdup_avx(auVar8);
      __x = auVar8._0_4_;
      fVar7 = atan2f(auVar12._0_4_,__x);
      if (fVar6 < 0.0) {
        auVar11._0_4_ = sqrtf(fVar6);
        auVar11._4_60_ = extraout_var;
        auVar18 = auVar11._0_16_;
      }
      else {
        auVar18 = vsqrtss_avx(ZEXT416((uint)fVar6),ZEXT416((uint)fVar6));
      }
      bVar2 = this->brdf->isotropic;
      fVar6 = ((float)((uint)(bVar2 & 1) * (int)(fVar7 - fVar5) +
                      (uint)!(bool)(bVar2 & 1) * (int)fVar7) + 3.1415927) / 6.2831855;
      auVar9 = vroundss_avx(ZEXT416((uint)fVar6),ZEXT416((uint)fVar6),9);
      auVar9 = vinsertps_avx(auVar18,ZEXT416((uint)(fVar6 - auVar9._0_4_)),0x10);
      local_18 = fVar5;
      local_14 = fVar4;
      PVar20 = PiecewiseLinear2D<2UL>::Invert(&this->brdf->vndf,(Vector2f)auVar9._0_8_,&local_18);
      fVar6 = PiecewiseLinear2D<2UL>::Evaluate
                        (&this->brdf->luminance,PVar20.p.super_Tuple2<pbrt::Vector2,_float>,
                         &local_18);
      auVar14 = vfmadd231ss_fma(ZEXT416((uint)(auVar12._0_4_ * auVar14._0_4_)),auVar8,
                                ZEXT416((uint)__x_00));
      auVar13._0_4_ = __x * __x;
      auVar13._4_4_ = auVar8._4_4_ * auVar8._4_4_;
      auVar13._8_4_ = auVar8._8_4_ * auVar8._8_4_;
      auVar13._12_4_ = auVar8._12_4_ * auVar8._12_4_;
      auVar14 = vfmadd132ss_fma(ZEXT416((uint)fVar3),auVar14,ZEXT416((uint)auVar16._0_4_));
      auVar8 = vhaddps_avx(auVar13,auVar13);
      local_78 = auVar18._0_4_;
      auVar8 = vsqrtss_avx(auVar8,auVar8);
      auVar8 = vmaxss_avx(SUB6416(ZEXT464(0x358637bd),0),
                          ZEXT416((uint)(auVar8._0_4_ * local_78 * 19.73921)));
      FVar19 = (fVar6 * PVar20.pdf) / (auVar14._0_4_ * 4.0 * auVar8._0_4_);
    }
  }
  return FVar19;
}

Assistant:

Float MeasuredBxDF::PDF(Vector3f wo, Vector3f wi, TransportMode mode,
                        BxDFReflTransFlags sampleFlags) const {
    if (!(sampleFlags & BxDFReflTransFlags::Reflection))
        return 0;
    if (!SameHemisphere(wo, wi))
        return 0;
    if (wo.z < 0) {
        wo = -wo;
        wi = -wi;
    }

    Vector3f wm = wi + wo;
    if (LengthSquared(wm) == 0)
        return 0;
    wm = Normalize(wm);

    /* Cartesian -> spherical coordinates */
    Float theta_i = SphericalTheta(wi), phi_i = std::atan2(wi.y, wi.x);
    Float theta_m = SphericalTheta(wm), phi_m = std::atan2(wm.y, wm.x);

    /* Spherical coordinates -> unit coordinate system */
    Vector2f u_wm(theta2u(theta_m), phi2u(brdf->isotropic ? (phi_m - phi_i) : phi_m));
    u_wm.y = u_wm.y - std::floor(u_wm.y);

    Float params[2] = {phi_i, theta_i};
    auto ui = brdf->vndf.Invert(u_wm, params);
    Vector2f sample = ui.p;
    Float vndfPDF = ui.pdf;

    Float pdf = brdf->luminance.Evaluate(sample, params);
    Float sinTheta_m = std::sqrt(Sqr(wm.x) + Sqr(wm.y));
    Float jacobian =
        4.f * Dot(wi, wm) * std::max<Float>(2 * Sqr(Pi) * u_wm.x * sinTheta_m, 1e-6f);
    return vndfPDF * pdf / jacobian;
}